

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

u32 calculate_min_match_len(u8 *data,size_t data_len,u32 max_search_depth)

{
  u32 in_EDX;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  u32 num_used_literals;
  u8 used [256];
  ulong local_140;
  ulong local_138;
  u32 local_12c;
  byte local_128 [268];
  u32 local_1c;
  ulong local_18;
  long local_10;
  u32 local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_128,0,0x100);
  local_12c = 0;
  if (local_18 < 0x200) {
    local_4 = 3;
  }
  else {
    if (local_18 < 0x1001) {
      local_140 = local_18;
    }
    else {
      local_140 = 0x1000;
    }
    local_18 = local_140;
    for (local_138 = 0; local_138 < local_18; local_138 = local_138 + 1) {
      local_128[*(byte *)(local_10 + local_138)] = 1;
    }
    for (local_138 = 0; local_138 < 0x100; local_138 = local_138 + 1) {
      local_12c = local_128[local_138] + local_12c;
    }
    local_4 = choose_min_match_len(local_12c,local_1c);
  }
  return local_4;
}

Assistant:

static u32
calculate_min_match_len(const u8 *data, size_t data_len, u32 max_search_depth)
{
	u8 used[256] = { 0 };
	u32 num_used_literals = 0;
	size_t i;

	/*
	 * For very short inputs, the static Huffman code has a good chance of
	 * being best, in which case there is no reason to avoid short matches.
	 */
	if (data_len < 512)
		return DEFLATE_MIN_MATCH_LEN;

	/*
	 * For an initial approximation, scan the first 4 KiB of data.  The
	 * caller may use recalculate_min_match_len() to update min_len later.
	 */
	data_len = MIN(data_len, 4096);
	for (i = 0; i < data_len; i++)
		used[data[i]] = 1;
	for (i = 0; i < 256; i++)
		num_used_literals += used[i];
	return choose_min_match_len(num_used_literals, max_search_depth);
}